

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_msg_internal_free(fio_msg_internal_s *m)

{
  uintptr_t *puVar1;
  uintptr_t uVar2;
  undefined4 local_70 [2];
  fio_msg_s tmp_msg;
  fio_msg_internal_s *m_local;
  
  LOCK();
  puVar1 = &m->ref;
  uVar2 = *puVar1;
  *puVar1 = *puVar1 - 1;
  UNLOCK();
  if (uVar2 == 1) {
    tmp_msg.is_json = '\0';
    tmp_msg._73_7_ = 0;
    while (m->meta_len != 0) {
      m->meta_len = m->meta_len - 1;
      if ((&m[1].channel)[m->meta_len].len != 0) {
        local_70[0] = 0;
        tmp_msg._0_8_ = (m->channel).capa;
        tmp_msg.channel.capa = (m->channel).len;
        tmp_msg.channel.len = (size_t)(m->channel).data;
        tmp_msg.channel.data = (char *)(m->data).capa;
        tmp_msg.msg.capa = (m->data).len;
        tmp_msg.msg.len = (size_t)(m->data).data;
        tmp_msg.msg.data = (char *)0x0;
        tmp_msg.udata1 = (void *)0x0;
        tmp_msg.udata2._0_1_ = 0;
        (*(code *)(&m[1].channel)[m->meta_len].len)(local_70,(&m[1].channel)[m->meta_len].data);
      }
    }
    fio_free(m);
  }
  return;
}

Assistant:

static inline void fio_msg_internal_free(fio_msg_internal_s *m) {
  if (fio_atomic_sub(&m->ref, 1))
    return;
  while (m->meta_len) {
    --m->meta_len;
    if (m->meta[m->meta_len].on_finish) {
      fio_msg_s tmp_msg = {
          .channel = m->channel,
          .msg = m->data,
      };
      m->meta[m->meta_len].on_finish(&tmp_msg, m->meta[m->meta_len].metadata);
    }
  }
  fio_free(m);
}